

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

curl_off_t multipart_size(curl_mime *mime)

{
  curl_off_t cVar1;
  curl_off_t sz;
  curl_mimepart *part;
  curl_off_t boundarysize;
  curl_off_t size;
  curl_mime *mime_local;
  
  if (mime == (curl_mime *)0x0) {
    mime_local = (curl_mime *)0x0;
  }
  else {
    boundarysize = 0x34;
    for (sz = (curl_off_t)mime->firstpart; sz != 0; sz = *(curl_off_t *)(sz + 8)) {
      cVar1 = Curl_mime_size((curl_mimepart *)sz);
      if (cVar1 < 0) {
        boundarysize = cVar1;
      }
      if (-1 < boundarysize) {
        boundarysize = cVar1 + 0x34 + boundarysize;
      }
    }
    mime_local = (curl_mime *)boundarysize;
  }
  return (curl_off_t)mime_local;
}

Assistant:

static curl_off_t multipart_size(curl_mime *mime)
{
  curl_off_t size;
  curl_off_t boundarysize;
  curl_mimepart *part;

  if(!mime)
    return 0;           /* Not present -> empty. */

  boundarysize = 4 + MIME_BOUNDARY_LEN + 2;
  size = boundarysize;  /* Final boundary - CRLF after headers. */

  for(part = mime->firstpart; part; part = part->nextpart) {
    curl_off_t sz = Curl_mime_size(part);

    if(sz < 0)
      size = sz;

    if(size >= 0)
      size += boundarysize + sz;
  }

  return size;
}